

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O3

lzma_ret lzma_properties_size(uint32_t *size,lzma_filter *filter)

{
  code *UNRECOVERED_JUMPTABLE;
  lzma_ret lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (*(lzma_vli *)((long)&encoders[0].id + lVar2) == filter->id) {
      UNRECOVERED_JUMPTABLE = *(code **)((long)&encoders[0].props_size_get + lVar2);
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        lVar1 = (*UNRECOVERED_JUMPTABLE)(size,filter->options);
        return lVar1;
      }
      *size = *(uint32_t *)((long)&encoders[0].props_size_fixed + lVar2);
      return LZMA_OK;
    }
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0x1f8);
  return (int)((long)filter->id >> 0x3f) * -3 + LZMA_OPTIONS_ERROR;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_size(uint32_t *size, const lzma_filter *filter)
{
	const lzma_filter_encoder *const fe = encoder_find(filter->id);
	if (fe == NULL) {
		// Unknown filter - if the Filter ID is a proper VLI,
		// return LZMA_OPTIONS_ERROR instead of LZMA_PROG_ERROR,
		// because it's possible that we just don't have support
		// compiled in for the requested filter.
		return filter->id <= LZMA_VLI_MAX
				? LZMA_OPTIONS_ERROR : LZMA_PROG_ERROR;
	}

	if (fe->props_size_get == NULL) {
		// No props_size_get() function, use props_size_fixed.
		*size = fe->props_size_fixed;
		return LZMA_OK;
	}

	return fe->props_size_get(size, filter->options);
}